

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_NtkPrintVecWin(Acb_Ntk_t *p,Vec_Int_t *vVec,char *pName)

{
  int iObj;
  int local_24;
  int i;
  char *pName_local;
  Vec_Int_t *vVec_local;
  Acb_Ntk_t *p_local;
  
  printf("%s: \n",pName);
  for (local_24 = 0; local_24 < vVec->nSize; local_24 = local_24 + 1) {
    iObj = Abc_Lit2Var(vVec->pArray[local_24]);
    Acb_NtkPrintNode(p,iObj);
  }
  printf("\n");
  return;
}

Assistant:

void Acb_NtkPrintVecWin( Acb_Ntk_t * p, Vec_Int_t * vVec, char * pName )
{
    int i;
    printf( "%s: \n", pName );
    for ( i = 0; i < vVec->nSize; i++ )
        Acb_NtkPrintNode( p, Abc_Lit2Var(vVec->pArray[i]) );
    printf( "\n" );
}